

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Reader * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::getParams
          (Reader *__return_storage_ptr__,RpcCallContext *this)

{
  undefined4 uVar1;
  bool bVar2;
  Fault local_48;
  Fault f;
  undefined1 local_38 [8];
  DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  RpcCallContext *this_local;
  
  _kjCondition._32_8_ = this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->request);
  kj::_::DebugExpression<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>&>::
  operator!=((DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_38,
             (DebugExpression<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>&> *)&f
             ,(None *)&kj::none);
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar2) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[46]>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xcb3,FAILED,"request != kj::none",
               "_kjCondition,\"Can\'t call getParams() after releaseParams().\"",
               (DebugComparison<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_&,_const_kj::None_&>
                *)local_38,(char (*) [46])"Can\'t call getParams() after releaseParams().");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  (__return_storage_ptr__->reader).segment = (this->params).reader.segment;
  (__return_storage_ptr__->reader).capTable = (this->params).reader.capTable;
  (__return_storage_ptr__->reader).pointer = (this->params).reader.pointer;
  uVar1 = *(undefined4 *)&(this->params).reader.field_0x1c;
  (__return_storage_ptr__->reader).nestingLimit = (this->params).reader.nestingLimit;
  *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c = uVar1;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Reader getParams() override {
      KJ_REQUIRE(request != kj::none, "Can't call getParams() after releaseParams().");
      return params;
    }